

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  StateVerifier *pSVar2;
  int iVar3;
  IsEnabledVerifier *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  GetBooleanVerifier *this_01;
  undefined4 extraout_var_00;
  GetIntegerVerifier *this_02;
  undefined4 extraout_var_01;
  GetFloatVerifier *this_03;
  undefined4 extraout_var_02;
  void *pvVar7;
  IsEnabledStateTestCase *this_04;
  char *pcVar8;
  long lVar9;
  SampleCoverageInvertTestCase *this_05;
  ColorMaskTestCase *this_06;
  DepthWriteMaskTestCase *this_07;
  ShaderCompilerTestCase *this_08;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  StateVerifier *local_298;
  StateVerifier *verifier_4;
  int _verifierNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  StateVerifier *local_248;
  StateVerifier *verifier_3;
  int _verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  StateVerifier *local_1f8;
  StateVerifier *verifier_2;
  int _verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  StateVerifier *local_1a8;
  StateVerifier *verifier_1;
  int _verifierNdx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  StateVerifier *local_158;
  StateVerifier *verifier;
  int _verifierNdx;
  int testNdx;
  StateBoolean isEnableds [9];
  StateVerifier *normalVerifiers [3];
  StateVerifier *isEnabledVerifiers [4];
  BooleanStateQueryTests *this_local;
  
  this_00 = (IsEnabledVerifier *)operator_new(0x28);
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::IsEnabledVerifier::IsEnabledVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar3),pTVar6);
  this->m_verifierIsEnabled = this_00;
  this_01 = (GetBooleanVerifier *)operator_new(0x28);
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar3),pTVar6);
  this->m_verifierBoolean = this_01;
  this_02 = (GetIntegerVerifier *)operator_new(0x28);
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar3),pTVar6);
  this->m_verifierInteger = this_02;
  this_03 = (GetFloatVerifier *)operator_new(0x28);
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = gles2::Context::getTestContext((this->super_TestCaseGroup).m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  BooleanStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_03,(Functions *)CONCAT44(extraout_var_02,iVar3),pTVar6);
  this->m_verifierFloat = this_03;
  isEnabledVerifiers[0] = &this->m_verifierBoolean->super_StateVerifier;
  isEnabledVerifiers[1] = &this->m_verifierInteger->super_StateVerifier;
  isEnabledVerifiers[2] = &this->m_verifierFloat->super_StateVerifier;
  normalVerifiers[0] = &this->m_verifierInteger->super_StateVerifier;
  normalVerifiers[1] = &this->m_verifierFloat->super_StateVerifier;
  pvVar7 = memcpy(&_verifierNdx,&PTR_anon_var_dwarf_d27c04_0327cb00,0xd8);
  verifier._4_4_ = 0;
  while ((int)verifier._4_4_ < 9) {
    for (verifier._0_4_ = 0; (int)verifier < 4; verifier._0_4_ = (int)verifier + 1) {
      local_158 = isEnabledVerifiers[(long)(int)verifier + -1];
      this_04 = (IsEnabledStateTestCase *)operator_new(0xa8);
      pSVar2 = local_158;
      verifier_1._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar8 = *(char **)(&_verifierNdx + (long)(int)verifier._4_4_ * 6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&_verifierNdx_1,pcVar8,(allocator<char> *)((long)&verifier_1 + 7));
      pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_158);
      std::operator+(&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_verifierNdx_1,pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar9 = (long)(int)verifier._4_4_;
      anon_unknown_2::IsEnabledStateTestCase::IsEnabledStateTestCase
                (this_04,pCVar1,pSVar2,pcVar8,isEnableds[lVar9].name,
                 *(GLenum *)&isEnableds[lVar9].description,
                 (bool)(*(byte *)((long)&isEnableds[lVar9].description + 4) & 1));
      verifier_1._6_1_ = 0;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&_verifierNdx_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_1 + 7));
    }
    verifier._4_4_ = verifier._4_4_ + 1;
    pvVar7 = (void *)(ulong)verifier._4_4_;
  }
  verifier_1._0_4_ = 0;
  while ((int)(uint)verifier_1 < 3) {
    local_1a8 = normalVerifiers[(long)(int)(uint)verifier_1 + -1];
    this_05 = (SampleCoverageInvertTestCase *)operator_new(0xa0);
    pSVar2 = local_1a8;
    verifier_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_2,"sample_coverage_invert",
               (allocator<char> *)((long)&verifier_2 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1a8);
    std::operator+(&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_2,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::SampleCoverageInvertTestCase::SampleCoverageInvertTestCase
              (this_05,pCVar1,pSVar2,pcVar8,"SAMPLE_COVERAGE_INVERT");
    verifier_2._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&_verifierNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_2 + 7));
    verifier_1._0_4_ = (uint)verifier_1 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_1;
  }
  verifier_2._0_4_ = 0;
  while ((int)(uint)verifier_2 < 3) {
    local_1f8 = normalVerifiers[(long)(int)(uint)verifier_2 + -1];
    this_06 = (ColorMaskTestCase *)operator_new(0xa0);
    pSVar2 = local_1f8;
    verifier_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_3,"color_writemask",
               (allocator<char> *)((long)&verifier_3 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_1f8);
    std::operator+(&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_3,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ColorMaskTestCase::ColorMaskTestCase
              (this_06,pCVar1,pSVar2,pcVar8,"COLOR_WRITEMASK");
    verifier_3._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&_verifierNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_3 + 7));
    verifier_2._0_4_ = (uint)verifier_2 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_2;
  }
  verifier_3._0_4_ = 0;
  while ((int)(uint)verifier_3 < 3) {
    local_248 = normalVerifiers[(long)(int)(uint)verifier_3 + -1];
    this_07 = (DepthWriteMaskTestCase *)operator_new(0xa0);
    pSVar2 = local_248;
    verifier_4._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_verifierNdx_4,"depth_writemask",
               (allocator<char> *)((long)&verifier_4 + 7));
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_248);
    std::operator+(&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &_verifierNdx_4,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::DepthWriteMaskTestCase::DepthWriteMaskTestCase
              (this_07,pCVar1,pSVar2,pcVar8,"DEPTH_WRITEMASK");
    verifier_4._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&_verifierNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifier_4 + 7));
    verifier_3._0_4_ = (uint)verifier_3 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_3;
  }
  verifier_4._0_4_ = 0;
  while ((int)(uint)verifier_4 < 3) {
    local_298 = normalVerifiers[(long)(int)(uint)verifier_4 + -1];
    this_08 = (ShaderCompilerTestCase *)operator_new(0xa0);
    pSVar2 = local_298;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"shader_compiler",&local_2d9);
    pcVar8 = BooleanStateQueryVerifiers::StateVerifier::getTestNamePostfix(local_298);
    std::operator+(&local_2b8,&local_2d8,pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    anon_unknown_2::ShaderCompilerTestCase::ShaderCompilerTestCase
              (this_08,pCVar1,pSVar2,pcVar8,"SHADER_COMPILER");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_08);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    verifier_4._0_4_ = (uint)verifier_4 + 1;
    pvVar7 = (void *)(ulong)(uint)verifier_4;
  }
  return (int)pvVar7;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierIsEnabled == DE_NULL);
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierIsEnabled		= new IsEnabledVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* isEnabledVerifiers[] = {m_verifierIsEnabled, m_verifierBoolean, m_verifierInteger, m_verifierFloat};
	StateVerifier* normalVerifiers[]	= {						m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		bool			value;
	};
	const StateBoolean isEnableds[] =
	{
		{ "cull_face",						"CULL_FACE",						GL_CULL_FACE,						false},
		{ "polygon_offset_fill",			"POLYGON_OFFSET_FILL",				GL_POLYGON_OFFSET_FILL,				false},
		{ "sample_alpha_to_coverage",		"SAMPLE_ALPHA_TO_COVERAGE",			GL_SAMPLE_ALPHA_TO_COVERAGE,		false},
		{ "sample_coverage",				"SAMPLE_COVERAGE",					GL_SAMPLE_COVERAGE,					false},
		{ "scissor_test",					"SCISSOR_TEST",						GL_SCISSOR_TEST,					false},
		{ "stencil_test",					"STENCIL_TEST",						GL_STENCIL_TEST,					false},
		{ "depth_test",						"DEPTH_TEST",						GL_DEPTH_TEST,						false},
		{ "blend",							"BLEND",							GL_BLEND,							false},
		{ "dither",							"DITHER",							GL_DITHER,							true },
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
		FOR_EACH_VERIFIER(isEnabledVerifiers, addChild(new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + verifier->getTestNamePostfix()).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value)));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SampleCoverageInvertTestCase				(m_context, verifier, (std::string("sample_coverage_invert")				+ verifier->getTestNamePostfix()).c_str(), "SAMPLE_COVERAGE_INVERT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ColorMaskTestCase							(m_context, verifier, (std::string("color_writemask")						+ verifier->getTestNamePostfix()).c_str(), "COLOR_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthWriteMaskTestCase						(m_context, verifier, (std::string("depth_writemask")						+ verifier->getTestNamePostfix()).c_str(), "DEPTH_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ShaderCompilerTestCase						(m_context, verifier, (std::string("shader_compiler")						+ verifier->getTestNamePostfix()).c_str(), "SHADER_COMPILER")));
}